

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_string_in_fixed_set.c
# Opt level: O0

int IsMatchUnchecked(uchar matcher,char *key,char *multibyte_start)

{
  int iVar1;
  byte *in_RDX;
  byte *in_RSI;
  byte in_DIL;
  undefined4 local_4;
  
  if (in_RDX == (byte *)0x0) {
    iVar1 = GetMultibyteLength(*in_RSI);
    if (iVar1 == 0) {
      local_4 = (uint)(in_DIL == *in_RSI);
    }
    else {
      local_4 = (uint)(in_DIL == 0x1f);
    }
  }
  else if (in_RDX == in_RSI) {
    local_4 = (uint)((in_DIL ^ 0x80) == *in_RSI);
  }
  else {
    local_4 = (uint)((in_DIL ^ 0xc0) == *in_RSI);
  }
  return local_4;
}

Assistant:

static int IsMatchUnchecked(const unsigned char matcher,
	const char* key,
	const char* multibyte_start)
{
	if (multibyte_start) {
		/* Multibyte matching mode. */
		if (multibyte_start == key) {
			/* Match leading byte, which will also match the sequence length. */
			return (matcher ^ 0x80) == (const unsigned char)*key;
		} else {
			/* Match following bytes. */
			return (matcher ^ 0xC0) == (const unsigned char)*key;
		}
	}
	/* If key points at a leading byte in a multibyte sequence, but we are not yet
	 * in multibyte mode, then the dafsa should contain a special byte to indicate
	 * a mode switch. */
	if (GetMultibyteLength(*key)) {
		return matcher == 0x1F;
	}
	/* Normal matching of a single byte character. */
	return matcher == (const unsigned char)*key;
}